

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_algebraic.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8739e::ir_algebraic_visitor::handle_rvalue
          (ir_algebraic_visitor *this,ir_rvalue **rvalue)

{
  ir_constant *ir1;
  ir_rvalue *piVar1;
  ir_rvalue *piVar2;
  long *plVar3;
  ir_instruction *piVar4;
  exec_node *peVar5;
  exec_node *peVar6;
  long lVar7;
  ir_rvalue **ppiVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  ir_constant **ppiVar13;
  long lVar14;
  undefined4 extraout_var;
  _func_int **pp_Var15;
  ir_expression *piVar16;
  ir_swizzle *this_00;
  ir_variable *piVar17;
  ir_assignment *piVar18;
  ir_constant **ppiVar19;
  operand oVar20;
  ir_constant *extraout_RAX;
  ir_variable *this_01;
  ir_constant *piVar21;
  operand oVar22;
  ir_constant *piVar23;
  operand oVar24;
  ir_constant *extraout_RAX_00;
  uint64_t uVar25;
  ir_constant *piVar26;
  undefined8 uVar27;
  glsl_type *pgVar28;
  bool bVar29;
  bool bVar30;
  int c;
  uint uVar31;
  ir_expression_operation iVar32;
  ir_expression *in_R8;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  bool bVar36;
  undefined4 uVar37;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float fVar38;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar39;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  ir_constant *op_const [4];
  ir_expression *op_expr [4];
  ir_constant_data data;
  long local_148;
  ir_constant *local_138 [2];
  long *local_128;
  undefined8 uStack_120;
  ir_constant *local_118 [4];
  ir_constant *local_f8;
  operand local_f0;
  operand local_e8;
  ulong local_e0;
  ir_rvalue **local_d8;
  operand local_d0;
  operand local_c8;
  operand local_c0;
  ir_constant_data local_b8;
  
  ir1 = (ir_constant *)*rvalue;
  if (ir1 == (ir_constant *)0x0) {
    return;
  }
  if ((ir1->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression) {
    return;
  }
  if ((ir1->value).u[0] == ir_last_opcode) {
    return;
  }
  uVar37 = 0;
  uVar39 = 0;
  local_128 = (long *)0x0;
  uStack_120 = 0;
  local_138[0] = (ir_constant *)0x0;
  local_138[1] = (ir_constant *)0x0;
  local_118[2] = (ir_constant *)0x0;
  local_118[3] = (ir_constant *)0x0;
  local_118[0] = (ir_constant *)0x0;
  local_118[1] = (ir_constant *)0x0;
  local_d8 = rvalue;
  if ((ir1->value).u[0] == ir_binop_mul) {
    piVar1 = (ir_rvalue *)(ir1->value).u64[1];
    if ((piVar1->type->matrix_columns < 2) || (2 < (byte)piVar1->type->field_0x4 - 2))
    goto LAB_0017c12a;
    pgVar28 = ((ir_rvalue *)(ir1->value).u64[2])->type;
    if ((pgVar28->vector_elements < 2) ||
       ((((pgVar28->matrix_columns != '\x01' || (0xb < (*(uint *)&pgVar28->field_0x4 & 0xfc))) ||
         ((piVar1->super_ir_instruction).ir_type != ir_type_expression)) ||
        (*(int *)&piVar1[1].super_ir_instruction._vptr_ir_instruction != 0x73)))) goto LAB_0017c12a;
    piVar2 = (ir_rvalue *)piVar1[1].super_ir_instruction.super_exec_node.next;
    pgVar28 = piVar2->type;
    if ((pgVar28->matrix_columns < 2) || (2 < (byte)pgVar28->field_0x4 - 2)) goto LAB_0017c12a;
    oVar20.val = (ir_rvalue *)piVar1[1].super_ir_instruction.super_exec_node.prev;
    pgVar28 = (oVar20.val)->type;
    if ((pgVar28->matrix_columns < 2) || (2 < (byte)pgVar28->field_0x4 - 2)) goto LAB_0017c12a;
    local_f0.val = &ir_builder::mul(oVar20,(ir_rvalue *)(ir1->value).u64[2])->super_ir_rvalue;
    local_e8.val = piVar2;
    goto LAB_0017d728;
  }
LAB_0017c12a:
  if (4 < (ir1->value).b[0x28]) {
    __assert_fail("ir->num_operands <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                  ,0x14e,
                  "ir_rvalue *(anonymous namespace)::ir_algebraic_visitor::handle_expression(ir_expression *)"
                 );
  }
  piVar21 = ir1;
  if ((ir1->value).b[0x28] != false) {
    uVar35 = 0;
    do {
      plVar3 = *(long **)((long)&ir1->value + uVar35 * 8 + 8);
      if ((1 < *(byte *)(plVar3[4] + 9)) && (*(byte *)(plVar3[4] + 4) - 2 < 3))
      goto switchD_0017c1d7_caseD_5e;
      pvVar12 = ralloc_parent(ir1);
      piVar23 = (ir_constant *)(**(code **)(*plVar3 + 0x30))(plVar3,pvVar12,0);
      local_138[uVar35] = piVar23;
      piVar23 = *(ir_constant **)((long)&ir1->value + uVar35 * 8 + 8);
      if ((piVar23->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression) {
        piVar23 = (ir_constant *)0x0;
      }
      local_118[uVar35] = piVar23;
      uVar35 = uVar35 + 1;
      uVar37 = extraout_XMM0_Da;
      uVar39 = extraout_XMM0_Db;
    } while (uVar35 < (ir1->value).b[0x28]);
  }
  pvVar12 = this->mem_ctx;
  if (pvVar12 == (void *)0x0) {
    pvVar12 = ralloc_parent(ir1);
    this->mem_ctx = pvVar12;
    uVar37 = extraout_XMM0_Da_00;
    uVar39 = extraout_XMM0_Db_00;
  }
  piVar26 = local_118[0];
  plVar3 = local_128;
  piVar23 = local_138[0];
  iVar32 = (ir1->value).u[0];
  if (0x39 < iVar32 - ir_unop_saturate) {
    piVar23 = local_118[0];
    switch(iVar32) {
    case ir_unop_bit_not:
      if (local_118[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
      bVar36 = (local_118[0]->value).u[0] == 0;
      break;
    case ir_unop_logic_not:
      if ((local_118[0] == (ir_constant *)0x0) ||
         (uVar31 = (local_118[0]->value).u[0] - 0x7a, 5 < uVar31)) goto switchD_0017c260_default;
      iVar32 = *(ir_expression_operation *)(&DAT_00211420 + (ulong)uVar31 * 4);
      piVar21 = (ir_constant *)exec_node::operator_new(0x58,pvVar12);
      pgVar28 = (ir1->super_ir_rvalue).type;
      piVar16 = *(ir_expression **)((long)&piVar26->value + 8);
      this_00 = (ir_swizzle *)(piVar26->value).d[2];
      goto LAB_0017d797;
    case ir_unop_neg:
      if (local_118[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
      bVar36 = (local_118[0]->value).u[0] == 2;
      break;
    case ir_unop_abs:
      if ((local_118[0] != (ir_constant *)0x0) && (((local_118[0]->value).u[0] & 0xfffffffe) == 2))
      {
        iVar11 = ir_builder::abs((int)*(undefined8 *)((long)&local_118[0]->value + 8));
        piVar21 = (ir_constant *)CONCAT44(extraout_var,iVar11);
      }
      goto switchD_0017c260_default;
    case ir_unop_sign:
    case ir_unop_rsq:
    case ir_unop_sqrt:
      goto switchD_0017c1d7_caseD_5e;
    case ir_unop_rcp:
      if (local_118[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
      switch((local_118[0]->value).u[0]) {
      case 5:
switchD_0017cd7e_caseD_5:
        piVar21 = *(ir_constant **)((long)&local_118[0]->value + 8);
        break;
      case 6:
        ir_builder::sqrt((double)CONCAT44(uVar39,uVar37));
        piVar21 = extraout_RAX;
        break;
      case 7:
        piVar21 = (ir_constant *)ir_builder::rsq(*(ir_rvalue **)((long)&local_118[0]->value + 8));
        break;
      case 8:
      case 10:
        piVar21 = (ir_constant *)exec_node::operator_new(0x58,pvVar12);
        iVar32 = (piVar26->value).i[0];
        pgVar28 = (ir1->super_ir_rvalue).type;
        piVar16 = ir_builder::neg(*(ir_rvalue **)((long)&piVar26->value + 8));
        goto LAB_0017cdb9;
      case 9:
        goto switchD_0017c1d7_caseD_5e;
      }
      goto switchD_0017c260_default;
    case ir_unop_exp:
      if (local_118[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
      bVar36 = (local_118[0]->value).u[0] == 9;
      break;
    case ir_unop_log:
      if (local_118[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
      bVar36 = (local_118[0]->value).u[0] == 8;
      break;
    case ir_unop_exp2:
      if (local_118[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
      if ((local_118[0]->value).u[0] == 0xb) goto switchD_0017cd7e_caseD_5;
      if (((local_118[0]->value).u[0] != 0x73) || (this->options->EmitNoPow != '\0'))
      goto switchD_0017c260_default;
      uVar35 = 0;
      bVar36 = true;
      do {
        bVar29 = bVar36;
        lVar14 = *(long *)((long)&local_118[0]->value + uVar35 * 8 + 8);
        if (((lVar14 != 0) && (*(int *)(lVar14 + 0x18) == 4)) && (*(int *)(lVar14 + 0x28) == 0xb)) {
          piVar21 = (ir_constant *)exec_node::operator_new(0x58,pvVar12);
          pgVar28 = (ir1->super_ir_rvalue).type;
          piVar16 = *(ir_expression **)(lVar14 + 0x30);
          this_00 = *(ir_swizzle **)((long)&piVar26->value + (uVar35 ^ 1) * 8 + 8);
          iVar32 = ir_binop_pow;
          goto LAB_0017d797;
        }
        uVar35 = 1;
        bVar36 = false;
      } while (bVar29);
      goto switchD_0017c1d7_caseD_5e;
    case ir_unop_log2:
      if (local_118[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
      bVar36 = (local_118[0]->value).u[0] == 10;
      break;
    case ir_unop_f2i:
    case ir_unop_f2u:
      if ((local_118[0] == (ir_constant *)0x0) || ((local_118[0]->value).u[0] != 0x3e))
      goto switchD_0017c260_default;
      piVar21 = (ir_constant *)exec_node::operator_new(0x58,pvVar12);
      iVar32 = (ir1->value).i[0];
      pgVar28 = (ir1->super_ir_rvalue).type;
      piVar16 = *(ir_expression **)((long)&piVar26->value + 8);
LAB_0017cdb9:
      this_00 = (ir_swizzle *)0x0;
LAB_0017d797:
      ir_expression::ir_expression
                ((ir_expression *)piVar21,iVar32,pgVar28,&piVar16->super_ir_rvalue,
                 &this_00->super_ir_rvalue,(ir_rvalue *)0x0,(ir_rvalue *)0x0);
    default:
      goto switchD_0017c260_default;
    }
    goto LAB_0017cebd;
  }
  ppiVar19 = local_138 + 1;
  switch(iVar32) {
  case ir_unop_saturate:
    if ((local_118[0] == (ir_constant *)0x0) || ((local_118[0]->value).u[0] != 0x6c))
    goto switchD_0017c260_default;
    lVar14 = *(long *)((long)&local_118[0]->value + 8);
    uVar25 = 0;
    if (*(int *)((local_118[0]->value).u64[2] + 0x18) == 4) {
      uVar25 = (local_118[0]->value).u64[2];
    }
    if ((((lVar14 == 0) || (*(int *)(lVar14 + 0x18) != 4)) || (uVar25 == 0)) ||
       ((*(int *)(lVar14 + 0x28) != 0x10 || (*(int *)(uVar25 + 0x28) != 0x10))))
    goto switchD_0017c260_default;
    oVar20.val = &ir_builder::logic_or
                            (*(ir_rvalue **)(lVar14 + 0x30),*(ir_rvalue **)(uVar25 + 0x30))->
                  super_ir_rvalue;
LAB_0017d564:
    piVar21 = (ir_constant *)ir_builder::b2f(oVar20);
    goto switchD_0017c260_default;
  case ir_unop_pack_double_2x32:
    piVar23 = (ir_constant *)(ir1->value).u64[1];
    if ((piVar23 == (ir_constant *)0x0) ||
       ((piVar23->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017c260_default;
    bVar36 = (piVar23->value).u[0] == 0x5d;
    goto LAB_0017cebd;
  case ir_unop_unpack_double_2x32:
    piVar23 = (ir_constant *)(ir1->value).u64[1];
    if ((piVar23 == (ir_constant *)0x0) ||
       ((piVar23->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017c260_default;
    bVar36 = (piVar23->value).u[0] == 0x5c;
    goto LAB_0017cebd;
  default:
    goto switchD_0017c1d7_caseD_5e;
  case ir_unop_interpolate_at_centroid:
  case ir_binop_interpolate_at_offset:
  case ir_binop_interpolate_at_sample:
    if (local_138[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
    break;
  case ir_unop_pack_int_2x32:
    piVar23 = (ir_constant *)(ir1->value).u64[1];
    if ((piVar23 == (ir_constant *)0x0) ||
       ((piVar23->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017c260_default;
    bVar36 = (piVar23->value).u[0] == 0x6a;
    goto LAB_0017cebd;
  case ir_unop_pack_uint_2x32:
    piVar23 = (ir_constant *)(ir1->value).u64[1];
    if ((piVar23 == (ir_constant *)0x0) ||
       ((piVar23->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017c260_default;
    bVar36 = (piVar23->value).u[0] == 0x6b;
    goto LAB_0017cebd;
  case ir_unop_unpack_int_2x32:
    piVar23 = (ir_constant *)(ir1->value).u64[1];
    if ((piVar23 == (ir_constant *)0x0) ||
       ((piVar23->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017c260_default;
    bVar36 = (piVar23->value).u[0] == 0x68;
    goto LAB_0017cebd;
  case ir_last_unop:
    piVar23 = (ir_constant *)(ir1->value).u64[1];
    if ((piVar23 == (ir_constant *)0x0) ||
       ((piVar23->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017c260_default;
    bVar36 = (piVar23->value).u[0] == 0x69;
LAB_0017cebd:
    if (bVar36) {
      piVar21 = *(ir_constant **)((long)&piVar23->value + 8);
    }
    goto switchD_0017c260_default;
  case ir_binop_add:
    if ((local_138[0] == (ir_constant *)0x0) ||
       (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (local_138[0]), (char)iVar11 == '\0')) {
      piVar21 = local_138[1];
      if ((local_138[1] != (ir_constant *)0x0) &&
         (iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                             (local_138[1]), (char)iVar11 != '\0')) break;
      lVar14 = 1;
      ppiVar19 = local_118;
      bVar36 = true;
      do {
        bVar29 = bVar36;
        piVar26 = *ppiVar19;
        if ((((piVar26 != (ir_constant *)0x0) && ((piVar26->value).u[0] == 2)) &&
            (lVar14 = *(long *)((long)&ir1->value + lVar14 * 8 + 8), lVar14 != 0)) &&
           (plVar3 = *(long **)((long)&piVar26->value + 8),
           cVar9 = (**(code **)(*plVar3 + 0x28))(plVar3,lVar14,0x17), cVar9 != '\0'))
        goto LAB_0017c943;
        lVar14 = 0;
        ppiVar19 = local_118 + 1;
        bVar36 = false;
      } while (bVar29);
      if (piVar21 == (ir_constant *)0x0 && piVar23 != (ir_constant *)0x0) {
        iVar11 = 0;
        piVar26 = local_118[1];
LAB_0017d319:
        reassociate_constant(this,(ir_expression *)ir1,iVar11,piVar26,in_R8);
      }
      else {
        piVar26 = (ir_constant *)&stack0xfffffffffffffe00;
        if (piVar23 == (ir_constant *)0x0 && piVar21 != (ir_constant *)0x0) {
          iVar11 = 1;
          piVar26 = local_118[0];
          goto LAB_0017d319;
        }
      }
      if ((this->options->OptimizeForAOS == '\0') ||
         (piVar21 = (ir_constant *)
                    try_replace_with_dot
                              ((ir_expression *)local_118[0],(ir_expression *)local_118[1],
                               this->mem_ctx), piVar21 == (ir_constant *)0x0)) {
        local_148 = 1;
        ppiVar19 = local_118;
        uVar35 = CONCAT71((int7)((ulong)piVar26 >> 8),1);
        do {
          local_f8 = *ppiVar19;
          local_e0 = uVar35;
          if ((local_f8 != (ir_constant *)0x0) && ((local_f8->value).u[0] == 0x73)) {
            uVar35 = 0;
            bVar36 = true;
            do {
              bVar29 = bVar36;
              lVar14 = *(long *)((long)&local_f8->value + uVar35 * 8 + 8);
              if (((lVar14 != 0) && (*(int *)(lVar14 + 0x18) == 4)) &&
                 (*(int *)(lVar14 + 0x28) == 0x6c)) {
                uVar33 = 0;
                bVar36 = true;
                do {
                  bVar30 = bVar36;
                  lVar7 = *(long *)(lVar14 + 0x30 + uVar33 * 8);
                  if (((lVar7 != 0) && (*(int *)(lVar7 + 0x18) == 4)) &&
                     (*(int *)(lVar7 + 0x28) == 2)) {
                    oVar20.val = *(ir_rvalue **)((long)&ir1->value + local_148 * 8 + 8);
                    cVar9 = (**(code **)(**(long **)(lVar7 + 0x30) + 0x28))
                                      (*(long **)(lVar7 + 0x30),oVar20.val,0x17);
                    if (((cVar9 != '\0') &&
                        (pgVar28 = (oVar20.val)->type, (byte)pgVar28->field_0x4 - 2 < 3)) &&
                       ((oVar22.val = *(ir_rvalue **)(lVar14 + 0x30 + (uVar33 ^ 1) * 8),
                        pgVar28 == (oVar22.val)->type &&
                        (oVar24.val = *(ir_rvalue **)((long)&local_f8->value + (uVar35 ^ 1) * 8 + 8)
                        , pgVar28 == (oVar24.val)->type)))) {
                      piVar21 = (ir_constant *)ir_builder::lrp(oVar20,oVar22,oVar24);
                      goto switchD_0017c260_default;
                    }
                  }
                  uVar33 = 1;
                  bVar36 = false;
                } while (bVar30);
              }
              uVar35 = 1;
              bVar36 = false;
            } while (bVar29);
          }
          local_148 = 0;
          ppiVar19 = local_118 + 1;
          uVar35 = 0;
          piVar21 = ir1;
        } while ((local_e0 & 1) != 0);
      }
      goto switchD_0017c260_default;
    }
    goto LAB_0017ccbd;
  case ir_binop_sub:
    if ((local_138[0] != (ir_constant *)0x0) &&
       (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
       (char)iVar11 != '\0')) {
LAB_0017c9bf:
      oVar20.val = (ir_rvalue *)(ir1->value).d[2];
LAB_0017c9c3:
      piVar21 = (ir_constant *)ir_builder::neg(oVar20);
      goto switchD_0017c260_default;
    }
LAB_0017c9cd:
    if (local_138[1] == (ir_constant *)0x0) goto switchD_0017c260_default;
    iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])();
    cVar9 = (char)iVar11;
    goto LAB_0017d2f8;
  case ir_binop_mul:
    if ((local_138[0] == (ir_constant *)0x0) ||
       (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (local_138[0]), (char)iVar11 == '\0')) {
      piVar26 = local_138[1];
      if ((local_138[1] != (ir_constant *)0x0) &&
         (iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                             (local_138[1]), (char)iVar11 != '\0')) break;
      if (((piVar23 != (ir_constant *)0x0) &&
          (iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                              (piVar23), (char)iVar11 != '\0')) ||
         ((piVar26 != (ir_constant *)0x0 &&
          (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                              (piVar26), (char)iVar11 != '\0')))) {
LAB_0017c943:
        pgVar28 = (ir1->super_ir_rvalue).type;
        piVar21 = ir1;
        goto LAB_0017d295;
      }
      if ((piVar23 != (ir_constant *)0x0) &&
         (iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xc])
                             (piVar23), (char)iVar11 != '\0')) goto LAB_0017c9bf;
      if ((piVar26 != (ir_constant *)0x0) &&
         (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xc])
                             (piVar26), (char)iVar11 != '\0')) {
        oVar20.val = (ir_rvalue *)(ir1->value).d[1];
        goto LAB_0017c9c3;
      }
      if (((local_118[0] != (ir_constant *)0x0) &&
          (local_118[1] != (ir_constant *)0x0 && (local_118[0]->value).u[0] == 0x10)) &&
         ((local_118[1]->value).u[0] == 0x10)) {
        oVar20.val = &ir_builder::logic_and
                                (*(ir_rvalue **)((long)&local_118[0]->value + 8),
                                 (ir_rvalue *)(local_118[1]->value).d[1])->super_ir_rvalue;
        goto LAB_0017d564;
      }
      if (piVar26 == (ir_constant *)0x0 && piVar23 != (ir_constant *)0x0) {
        iVar11 = 0;
        piVar23 = local_118[1];
LAB_0017d7b1:
        reassociate_constant(this,(ir_expression *)ir1,iVar11,piVar23,in_R8);
      }
      else if (piVar23 == (ir_constant *)0x0 && piVar26 != (ir_constant *)0x0) {
        iVar11 = 1;
        piVar23 = local_118[0];
        goto LAB_0017d7b1;
      }
      uVar35 = 0;
      bVar36 = true;
      do {
        bVar29 = bVar36;
        oVar20.val = *(ir_rvalue **)((long)&ir1->value + uVar35 * 8 + 8);
        lVar14 = *(long *)((long)&ir1->value + (uVar35 ^ 1) * 8 + 8);
        if (*(int *)(lVar14 + 0x18) != 4) {
          lVar14 = 0;
        }
        if (((((oVar20.val != (ir_rvalue *)0x0) &&
              (((oVar20.val)->super_ir_instruction).ir_type == ir_type_expression)) &&
             ((lVar14 != 0 &&
              ((*(int *)&oVar20.val[1].super_ir_instruction._vptr_ir_instruction == 4 &&
               (*(int *)(lVar14 + 0x28) == 0x40)))))) &&
            (lVar14 = *(long *)(lVar14 + 0x30), lVar14 != 0)) &&
           ((*(int *)(lVar14 + 0x18) == 4 && (*(int *)(lVar14 + 0x28) == 0x6c)))) {
          uVar35 = 0;
          bVar36 = true;
          do {
            bVar30 = bVar36;
            lVar7 = *(long *)(lVar14 + 0x30 + uVar35 * 8);
            if ((((lVar7 != 0) && (*(int *)(lVar7 + 0x18) == 4)) && (*(int *)(lVar7 + 0x28) == 3))
               && (((oVar22.val = *(ir_rvalue **)(lVar14 + 0x30 + (uVar35 ^ 1) * 8),
                    oVar22.val != (ir_rvalue *)0x0 &&
                    (((oVar22.val)->super_ir_instruction).ir_type == ir_type_constant)) &&
                   ((iVar11 = (*((oVar22.val)->super_ir_instruction)._vptr_ir_instruction[0xe])
                                        (0x3f000000,oVar22.val,0), (char)iVar11 != '\0' &&
                    (cVar9 = (**(code **)(**(long **)(lVar7 + 0x30) + 0x28))
                                       (*(long **)(lVar7 + 0x30),
                                        oVar20.val[1].super_ir_instruction.super_exec_node.next,0x17
                                       ), cVar9 != '\0')))))) {
              oVar24.val = *(ir_rvalue **)(lVar7 + 0x30);
              oVar20.val = &ir_builder::mul(oVar20,oVar22)->super_ir_rvalue;
              ir_builder::add(oVar24,oVar20);
              ir_builder::trunc((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
              piVar21 = extraout_RAX_00;
              goto switchD_0017c260_default;
            }
            uVar35 = 1;
            bVar36 = false;
          } while (bVar30);
        }
        uVar35 = 1;
        bVar36 = false;
      } while (bVar29);
      goto switchD_0017c260_default;
    }
    goto LAB_0017ccbd;
  case ir_binop_div:
    if (((local_138[0] != (ir_constant *)0x0) &&
        (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                            (), (char)iVar11 != '\0')) &&
       ((cVar9 = ((ir1->super_ir_rvalue).type)->field_0x4, cVar9 == '\x04' || (cVar9 == '\x02')))) {
      piVar21 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
      piVar16 = (ir_expression *)(ir1->value).u64[2];
      pgVar28 = (piVar16->super_ir_rvalue).type;
      iVar32 = ir_unop_rcp;
      goto LAB_0017cdb9;
    }
    if (local_138[1] == (ir_constant *)0x0) goto switchD_0017c260_default;
    iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])();
    cVar9 = (char)iVar11;
LAB_0017d2f8:
    if (cVar9 == '\0') goto switchD_0017c260_default;
    break;
  case ir_binop_less:
  case ir_binop_gequal:
  case ir_binop_equal:
  case ir_binop_nequal:
    bVar29 = false;
    ppiVar13 = local_118;
    bVar36 = true;
    do {
      bVar30 = bVar36;
      piVar23 = *ppiVar13;
      if ((((piVar23 != (ir_constant *)0x0) && ((piVar23->value).u[0] == 0x6c)) &&
          (*ppiVar19 != (ir_constant *)0x0)) &&
         ((iVar11 = (*((*ppiVar19)->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                              (), (char)iVar11 != '\0' &&
          (*(long *)((piVar23->value).u64[1] + 0x20) == *(long *)((piVar23->value).u64[2] + 0x20))))
         ) {
        piVar21 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
        iVar32 = (ir1->value).i[0];
        oVar20.val = *(ir_rvalue **)((long)&piVar23->value + 8);
        if (bVar29) {
          oVar20.val = &ir_builder::neg(oVar20)->super_ir_rvalue;
          piVar16 = (ir_expression *)(piVar23->value).d[2];
        }
        else {
          piVar16 = ir_builder::neg((ir_rvalue *)(piVar23->value).d[2]);
        }
        ir_expression::ir_expression
                  ((ir_expression *)piVar21,iVar32,oVar20.val,&piVar16->super_ir_rvalue);
        break;
      }
      bVar29 = true;
      ppiVar13 = local_118 + 1;
      ppiVar19 = local_138;
      bVar36 = false;
    } while (bVar30);
    goto switchD_0017c260_default;
  case ir_binop_all_equal:
  case ir_binop_any_nequal:
    pgVar28 = ((ir_rvalue *)(ir1->value).u64[1])->type;
    if (((pgVar28->vector_elements == '\x01') &&
        (((*(uint *)&pgVar28->field_0x4 & 0xfe) < 0xe &&
         (pgVar28 = ((ir_rvalue *)(ir1->value).u64[2])->type, pgVar28->vector_elements == '\x01'))))
       && ((*(uint *)&pgVar28->field_0x4 & 0xfe) < 0xe)) {
      piVar21 = (ir_constant *)exec_node::operator_new(0x58,pvVar12);
      ir_expression::ir_expression
                ((ir_expression *)piVar21,(ir1->value).u[0] == ir_binop_all_equal ^ 0x7d,
                 (ir_rvalue *)(ir1->value).d[1],(ir_rvalue *)(ir1->value).d[2]);
    }
    goto switchD_0017c260_default;
  case ir_binop_lshift:
  case ir_binop_rshift:
    if ((local_138[0] == (ir_constant *)0x0) ||
       (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
       (char)iVar11 == '\0')) goto LAB_0017c9cd;
    break;
  case ir_binop_logic_and:
    if ((local_138[0] != (ir_constant *)0x0) &&
       (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (local_138[0]), (char)iVar11 != '\0')) goto LAB_0017ccbd;
    piVar26 = local_138[1];
    if ((local_138[1] == (ir_constant *)0x0) ||
       (iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (local_138[1]), (char)iVar11 == '\0')) {
      if (((piVar23 != (ir_constant *)0x0) &&
          (iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                              (piVar23), (char)iVar11 != '\0')) ||
         ((piVar26 != (ir_constant *)0x0 &&
          (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                              (piVar26), (char)iVar11 != '\0')))) goto LAB_0017d28d;
      if (((local_118[0] != (ir_constant *)0x0) &&
          (local_118[1] != (ir_constant *)0x0 && (local_118[0]->value).u[0] == 1)) &&
         ((local_118[1]->value).u[0] == 1)) {
        oVar20.val = &ir_builder::logic_or
                                (*(ir_rvalue **)((long)&local_118[0]->value + 8),
                                 (ir_rvalue *)(local_118[1]->value).d[1])->super_ir_rvalue;
        goto LAB_0017d2db;
      }
LAB_0017d2e5:
      iVar11 = (*(((ir_rvalue *)(ir1->value).u64[1])->super_ir_instruction)._vptr_ir_instruction[5])
                         ((ir_rvalue *)(ir1->value).u64[1],(ir_rvalue *)(ir1->value).d[2],0x17);
      cVar9 = (char)iVar11;
      goto LAB_0017d2f8;
    }
    break;
  case ir_binop_logic_xor:
    if ((local_138[0] != (ir_constant *)0x0) &&
       (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (local_138[0]), (char)iVar11 != '\0')) goto LAB_0017ccbd;
    piVar26 = local_138[1];
    if ((local_138[1] == (ir_constant *)0x0) ||
       (iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (local_138[1]), (char)iVar11 == '\0')) {
      if ((piVar23 == (ir_constant *)0x0) ||
         (iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                             (piVar23), (char)iVar11 == '\0')) {
        if ((piVar26 == (ir_constant *)0x0) ||
           (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                               (piVar26), (char)iVar11 == '\0')) {
          iVar11 = (*(((ir_rvalue *)(ir1->value).u64[1])->super_ir_instruction)._vptr_ir_instruction
                     [5])((ir_rvalue *)(ir1->value).u64[1],(ir_rvalue *)(ir1->value).d[2],0x17);
          if ((char)iVar11 == '\0') goto switchD_0017c260_default;
          goto LAB_0017d28d;
        }
        oVar20.val = (ir_rvalue *)(ir1->value).d[1];
      }
      else {
        oVar20.val = (ir_rvalue *)(ir1->value).d[2];
      }
LAB_0017d2db:
      piVar21 = (ir_constant *)ir_builder::logic_not(oVar20);
      goto switchD_0017c260_default;
    }
    break;
  case ir_binop_logic_or:
    if ((local_138[0] != (ir_constant *)0x0) &&
       (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (local_138[0]), (char)iVar11 != '\0')) goto LAB_0017ccbd;
    piVar26 = local_138[1];
    if ((local_138[1] == (ir_constant *)0x0) ||
       (iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (local_138[1]), (char)iVar11 == '\0')) {
      if (((piVar23 != (ir_constant *)0x0) &&
          (iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                              (piVar23), (char)iVar11 != '\0')) ||
         ((piVar26 != (ir_constant *)0x0 &&
          (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                              (piVar26), (char)iVar11 != '\0')))) {
        local_b8.u64[0] = 0x101010101010101;
        local_b8.u64[1] = 0x101010101010101;
        piVar21 = (ir_constant *)exec_node::operator_new(0xb0,this->mem_ctx);
        ir_constant::ir_constant(piVar21,(ir1->super_ir_rvalue).type,&local_b8);
        goto switchD_0017c260_default;
      }
      if (((local_118[0] == (ir_constant *)0x0) ||
          (local_118[1] == (ir_constant *)0x0 || (local_118[0]->value).u[0] != 1)) ||
         ((local_118[1]->value).u[0] != 1)) goto LAB_0017d2e5;
      oVar20.val = &ir_builder::logic_and
                              (*(ir_rvalue **)((long)&local_118[0]->value + 8),
                               (ir_rvalue *)(local_118[1]->value).d[1])->super_ir_rvalue;
      goto LAB_0017d2db;
    }
    break;
  case ir_binop_dot:
    if (local_138[0] == (ir_constant *)0x0) {
      if (local_138[1] == (ir_constant *)0x0) goto switchD_0017c260_default;
      pp_Var15 = (local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction;
      piVar23 = local_138[1];
LAB_0017cf8f:
      iVar11 = (*pp_Var15[10])(local_138[1]);
      if ((char)iVar11 == '\0') {
LAB_0017cf9a:
        local_b8.d[0] = 0.0;
        local_b8.d[1] = 0.0;
        if (((piVar23->super_ir_rvalue).type)->vector_elements == '\0')
        goto switchD_0017c260_default;
        uVar35 = 0;
        uVar31 = 0;
        do {
          iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                             (piVar23);
          if ((char)iVar11 == '\0') {
            *(uint *)((long)&local_b8 + uVar35 * 4) = uVar31;
            uVar35 = (ulong)((int)uVar35 + 1);
          }
          uVar31 = uVar31 + 1;
          uVar34 = (uint)((piVar23->super_ir_rvalue).type)->vector_elements;
        } while (uVar31 < uVar34);
        uVar31 = (uint)uVar35;
        if (uVar34 <= uVar31) goto switchD_0017c260_default;
        iVar32 = ir_binop_dot;
        if (uVar31 == 1) {
          iVar32 = ir_binop_mul;
        }
        piVar21 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
        pgVar28 = (ir1->super_ir_rvalue).type;
        piVar16 = (ir_expression *)exec_node::operator_new(0x38,this->mem_ctx);
        ir_swizzle::ir_swizzle
                  ((ir_swizzle *)piVar16,(ir_rvalue *)(ir1->value).d[1],local_b8.u,uVar31);
        this_00 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
        ir_swizzle::ir_swizzle(this_00,(ir_rvalue *)(ir1->value).d[2],local_b8.u,uVar31);
        goto LAB_0017d797;
      }
    }
    else {
      iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                         (local_138[0]);
      if ((char)iVar11 == '\0') {
        if (local_138[1] != (ir_constant *)0x0) {
          pp_Var15 = (local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction;
          goto LAB_0017cf8f;
        }
        goto LAB_0017cf9a;
      }
    }
LAB_0017d28d:
    pgVar28 = (ir1->super_ir_rvalue).type;
    piVar21 = (ir_constant *)this->mem_ctx;
LAB_0017d295:
    piVar21 = ir_constant::zero(piVar21,pgVar28);
    goto switchD_0017c260_default;
  case ir_binop_min:
  case ir_binop_max:
    if ((((ir1->super_ir_rvalue).type)->field_0x4 != '\x02') || (this->options->EmitNoSat != '\0'))
    goto switchD_0017c260_default;
    ppiVar13 = local_118;
    uVar27 = CONCAT71((int7)((ulong)((long)&switchD_0017c1d7::switchdataD_002112f8 +
                                    (long)(int)(&switchD_0017c1d7::switchdataD_002112f8)
                                               [iVar32 - ir_unop_saturate]) >> 8),1);
    do {
      local_f8 = (ir_constant *)CONCAT44(local_f8._4_4_,(int)uVar27);
      piVar23 = *ppiVar13;
      piVar26 = *ppiVar19;
      if ((piVar26 != (ir_constant *)0x0 && piVar23 != (ir_constant *)0x0) &&
         ((piVar23->value).u[0] == ((ir1->value).u[0] != ir_binop_max) + 0x89)) {
        if ((((piVar23->value).u64[1] == 0) || (*(int *)((piVar23->value).u64[1] + 0x18) != 3)) &&
           (((piVar23->value).u64[2] == 0 || (*(int *)((piVar23->value).u64[2] + 0x18) != 3))))
        break;
        uVar35 = 0;
        bVar36 = true;
        do {
          bVar29 = bVar36;
          oVar20.val = *(ir_rvalue **)((long)&piVar23->value + (uVar35 ^ 1) * 8 + 8);
          if (((ir_constant *)oVar20.val != (ir_constant *)0x0) &&
             ((((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->super_ir_instruction).ir_type ==
              ir_type_constant)) {
            oVar22.val = *(ir_rvalue **)((long)&piVar23->value + uVar35 * 8 + 8);
            iVar32 = (ir1->value).u[0];
            if (iVar32 == ir_binop_min) {
              iVar11 = (*(((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->super_ir_instruction).
                         _vptr_ir_instruction[10])(oVar20.val);
              if (((char)iVar11 == '\0') ||
                 (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction
                             [0xb])(piVar26), (char)iVar11 == '\0')) {
                iVar32 = (ir1->value).u[0];
                goto LAB_0017c3d4;
              }
            }
            else {
LAB_0017c3d4:
              if (((iVar32 != ir_binop_max) ||
                  (iVar11 = (*(((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->
                              super_ir_instruction)._vptr_ir_instruction[0xb])(oVar20.val),
                  (char)iVar11 == '\0')) ||
                 (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction
                             [10])(piVar26), (char)iVar11 == '\0')) {
                iVar32 = (ir1->value).u[0];
                if (iVar32 != ir_binop_min) {
LAB_0017c47d:
                  if (iVar32 == ir_binop_max) {
                    pgVar28 = ((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->type;
                    if (pgVar28->field_0x4 != '\x02') {
LAB_0017da3e:
                      __assert_fail("ir->type->is_float()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                                    ,0x94,"bool is_less_than_one(ir_constant *)");
                    }
                    if ((pgVar28->vector_elements == '\x01') ||
                       ((pgVar28->vector_elements != '\0' && (pgVar28->matrix_columns == '\x01'))))
                    {
                      uVar31 = 0;
                      uVar34 = 0;
                      do {
                        fVar38 = ir_constant::get_float_component((ir_constant *)oVar20.val,uVar31);
                        uVar34 = uVar34 + (fVar38 < 1.0);
                        uVar31 = uVar31 + 1;
                        uVar10 = (uint)((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->type->
                                       vector_elements;
                      } while (uVar31 < uVar10);
                      if ((uVar34 == uVar10) &&
                         (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction.
                                     _vptr_ir_instruction[10])(piVar26), (char)iVar11 != '\0')) {
                        iVar32 = ir_binop_min;
                        goto LAB_0017d8e6;
                      }
                    }
                  }
                  iVar32 = (ir1->value).u[0];
                  if (iVar32 == ir_binop_max) {
                    iVar11 = (*(((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->
                               super_ir_instruction)._vptr_ir_instruction[0xb])(oVar20.val);
                    if ((char)iVar11 != '\0') {
                      pgVar28 = (piVar26->super_ir_rvalue).type;
                      if (pgVar28->field_0x4 != '\x02') goto LAB_0017da5d;
                      if ((pgVar28->vector_elements == '\x01') ||
                         ((pgVar28->vector_elements != '\0' && (pgVar28->matrix_columns == '\x01')))
                         ) {
                        uVar31 = 0;
                        uVar34 = 0;
                        do {
                          fVar38 = ir_constant::get_float_component(piVar26,uVar31);
                          uVar34 = uVar34 + (0.0 < fVar38);
                          uVar31 = uVar31 + 1;
                          uVar10 = (uint)((piVar26->super_ir_rvalue).type)->vector_elements;
                        } while (uVar31 < uVar10);
                        if (uVar34 == uVar10) {
                          iVar32 = ir_binop_max;
                          oVar20.val = &piVar26->super_ir_rvalue;
                          goto LAB_0017d8e6;
                        }
                      }
                    }
                    iVar32 = (ir1->value).u[0];
                  }
                  if (iVar32 == ir_binop_min) {
                    pgVar28 = ((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->type;
                    if (pgVar28->field_0x4 != '\x02') {
LAB_0017da5d:
                      __assert_fail("ir->type->is_float()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                                    ,0xa5,"bool is_greater_than_zero(ir_constant *)");
                    }
                    if ((pgVar28->vector_elements == '\x01') ||
                       ((pgVar28->vector_elements != '\0' && (pgVar28->matrix_columns == '\x01'))))
                    {
                      uVar31 = 0;
                      uVar34 = 0;
                      do {
                        fVar38 = ir_constant::get_float_component((ir_constant *)oVar20.val,uVar31);
                        uVar34 = uVar34 + (0.0 < fVar38);
                        uVar31 = uVar31 + 1;
                        uVar10 = (uint)((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->type->
                                       vector_elements;
                      } while (uVar31 < uVar10);
                      if ((uVar34 == uVar10) &&
                         (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction.
                                     _vptr_ir_instruction[0xb])(piVar26), (char)iVar11 != '\0')) {
                        iVar32 = ir_binop_max;
                        goto LAB_0017d8e6;
                      }
                    }
                  }
                  goto LAB_0017c5e7;
                }
                iVar11 = (*(((ir_rvalue *)&(oVar20.val)->super_ir_instruction)->super_ir_instruction
                           )._vptr_ir_instruction[10])(oVar20.val);
                if ((char)iVar11 == '\0') goto LAB_0017c479;
                pgVar28 = (piVar26->super_ir_rvalue).type;
                if (pgVar28->field_0x4 != '\x02') goto LAB_0017da3e;
                if ((pgVar28->vector_elements != '\x01') &&
                   ((pgVar28->vector_elements == '\0' || (pgVar28->matrix_columns != '\x01')))) {
LAB_0017c479:
                  iVar32 = (ir1->value).u[0];
                  goto LAB_0017c47d;
                }
                uVar31 = 0;
                uVar34 = 0;
                do {
                  fVar38 = ir_constant::get_float_component(piVar26,uVar31);
                  uVar34 = uVar34 + (fVar38 < 1.0);
                  uVar31 = uVar31 + 1;
                  uVar10 = (uint)((piVar26->super_ir_rvalue).type)->vector_elements;
                } while (uVar31 < uVar10);
                if (uVar34 != uVar10) goto LAB_0017c479;
                iVar32 = ir_binop_min;
                oVar20.val = &piVar26->super_ir_rvalue;
LAB_0017d8e6:
                oVar22.val = &ir_builder::expr(iVar32,oVar22,oVar20)->super_ir_rvalue;
              }
            }
            piVar21 = (ir_constant *)ir_builder::saturate(oVar22);
            goto switchD_0017c260_default;
          }
LAB_0017c5e7:
          uVar35 = 1;
          bVar36 = false;
        } while (bVar29);
      }
      ppiVar13 = local_118 + 1;
      ppiVar19 = local_138;
      uVar27 = 0;
    } while (((ulong)local_f8 & 1) != 0);
    goto switchD_0017c1d7_caseD_5e;
  case ir_binop_pow:
    if ((local_138[0] != (ir_constant *)0x0) &&
       (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (local_138[0]), piVar21 = piVar23, (char)iVar11 != '\0'))
    goto switchD_0017c260_default;
    piVar26 = local_138[1];
    if ((local_138[1] == (ir_constant *)0x0) ||
       (iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (local_138[1]), (char)iVar11 == '\0')) {
      if ((piVar23 != (ir_constant *)0x0) &&
         (iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xe])
                             (0x40000000,piVar23,2), (char)iVar11 != '\0')) {
        piVar21 = (ir_constant *)ir_builder::expr(ir_unop_exp2,(ir_rvalue *)(ir1->value).d[2]);
        goto switchD_0017c260_default;
      }
      piVar21 = ir1;
      if (piVar26 == (ir_constant *)0x0) goto switchD_0017c260_default;
      iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xe])
                         (0x40000000,piVar26,2);
      if ((char)iVar11 == '\0') {
        iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xe])
                           (0x40800000,piVar26,4);
        if ((char)iVar11 == '\0') goto switchD_0017c260_default;
        piVar17 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (piVar17,((ir_rvalue *)(ir1->value).u64[2])->type,"x",ir_var_temporary);
        piVar4 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar6 = &(piVar17->super_ir_instruction).super_exec_node;
        (piVar17->super_ir_instruction).super_exec_node.next = &piVar4->super_exec_node;
        peVar5 = (piVar4->super_exec_node).prev;
        (piVar17->super_ir_instruction).super_exec_node.prev = peVar5;
        peVar5->next = peVar6;
        (piVar4->super_exec_node).prev = peVar6;
        ir_builder::deref::deref((deref *)local_b8.d,piVar17);
        piVar18 = ir_builder::assign((deref)local_b8.d[0],(ir_rvalue *)(ir1->value).d[1]);
        if (piVar18 != (ir_assignment *)0x0) {
          piVar18 = (ir_assignment *)&(piVar18->super_ir_instruction).super_exec_node;
        }
        (piVar18->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar4->super_exec_node;
        peVar6 = (piVar4->super_exec_node).prev;
        (piVar18->super_ir_instruction).super_exec_node.next = peVar6;
        peVar6->next = (exec_node *)piVar18;
        (piVar4->super_exec_node).prev = (exec_node *)piVar18;
        this_01 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (this_01,((ir_rvalue *)(ir1->value).u64[2])->type,"squared",ir_var_temporary);
        piVar4 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar6 = &(this_01->super_ir_instruction).super_exec_node;
        (this_01->super_ir_instruction).super_exec_node.next = &piVar4->super_exec_node;
        peVar5 = (piVar4->super_exec_node).prev;
        (this_01->super_ir_instruction).super_exec_node.prev = peVar5;
        peVar5->next = peVar6;
        (piVar4->super_exec_node).prev = peVar6;
        ir_builder::deref::deref((deref *)&local_e8,this_01);
        ir_builder::operand::operand(&local_f0,piVar17);
        ir_builder::operand::operand(&local_c0,piVar17);
        oVar20.val = &ir_builder::mul(local_f0,local_c0)->super_ir_rvalue;
        piVar18 = ir_builder::assign((deref)local_e8.val,oVar20);
        if (piVar18 != (ir_assignment *)0x0) {
          piVar18 = (ir_assignment *)&(piVar18->super_ir_instruction).super_exec_node;
        }
        (piVar18->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar4->super_exec_node;
        peVar6 = (piVar4->super_exec_node).prev;
        (piVar18->super_ir_instruction).super_exec_node.next = peVar6;
        peVar6->next = (exec_node *)piVar18;
        (piVar4->super_exec_node).prev = (exec_node *)piVar18;
        ir_builder::operand::operand(&local_c8,this_01);
        ir_builder::operand::operand(&local_d0,this_01);
        local_f0.val = local_d0.val;
        local_e8.val = local_c8.val;
      }
      else {
        piVar17 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (piVar17,((ir_rvalue *)(ir1->value).u64[2])->type,"x",ir_var_temporary);
        piVar4 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar6 = &(piVar17->super_ir_instruction).super_exec_node;
        (piVar17->super_ir_instruction).super_exec_node.next = &piVar4->super_exec_node;
        peVar5 = (piVar4->super_exec_node).prev;
        (piVar17->super_ir_instruction).super_exec_node.prev = peVar5;
        peVar5->next = peVar6;
        (piVar4->super_exec_node).prev = peVar6;
        ir_builder::deref::deref((deref *)local_b8.d,piVar17);
        piVar18 = ir_builder::assign((deref)local_b8.d[0],(ir_rvalue *)(ir1->value).d[1]);
        if (piVar18 != (ir_assignment *)0x0) {
          piVar18 = (ir_assignment *)&(piVar18->super_ir_instruction).super_exec_node;
        }
        (piVar18->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar4->super_exec_node;
        peVar6 = (piVar4->super_exec_node).prev;
        (piVar18->super_ir_instruction).super_exec_node.next = peVar6;
        peVar6->next = (exec_node *)piVar18;
        (piVar4->super_exec_node).prev = (exec_node *)piVar18;
        ir_builder::operand::operand(&local_e8,piVar17);
        ir_builder::operand::operand(&local_f0,piVar17);
      }
      goto LAB_0017d728;
    }
    break;
  case ir_triop_fma:
    if (((local_138[0] != (ir_constant *)0x0) &&
        (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                            (local_138[0]), (char)iVar11 != '\0')) ||
       ((piVar26 = local_138[1], local_138[1] != (ir_constant *)0x0 &&
        (iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                            (local_138[1]), (char)iVar11 != '\0')))) {
LAB_0017cb54:
      piVar21 = (ir_constant *)(ir1->value).u64[3];
      goto switchD_0017c260_default;
    }
    if ((local_128 == (long *)0x0) || (cVar9 = (**(code **)(*local_128 + 0x50))(), cVar9 == '\0')) {
      if ((piVar23 == (ir_constant *)0x0) ||
         (iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                             (piVar23), (char)iVar11 == '\0')) {
        if ((piVar26 == (ir_constant *)0x0) ||
           (iVar11 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                               (piVar26), (char)iVar11 == '\0')) goto switchD_0017c260_default;
        oVar20.val = (ir_rvalue *)(ir1->value).d[1];
      }
      else {
        oVar20.val = (ir_rvalue *)(ir1->value).d[2];
      }
      piVar21 = (ir_constant *)ir_builder::add(oVar20,(ir_rvalue *)(ir1->value).d[3]);
      goto switchD_0017c260_default;
    }
    local_e8.val = (ir_rvalue *)(ir1->value).d[1];
    local_f0.val = (ir_rvalue *)(ir1->value).d[2];
LAB_0017d728:
    piVar21 = (ir_constant *)ir_builder::mul(local_e8,local_f0);
    goto switchD_0017c260_default;
  case ir_triop_lrp:
    if (local_128 != (long *)0x0) {
      cVar9 = (**(code **)(*local_128 + 0x50))(local_128);
      if (cVar9 != '\0') break;
      cVar9 = (**(code **)(*plVar3 + 0x58))(plVar3);
      if (cVar9 != '\0') goto LAB_0017ccbd;
    }
    iVar11 = (*(((ir_rvalue *)(ir1->value).u64[1])->super_ir_instruction)._vptr_ir_instruction[5])
                       ((ir_rvalue *)(ir1->value).u64[1],(ir_rvalue *)(ir1->value).d[2],0x17);
    if ((char)iVar11 == '\0') {
      if ((local_138[0] == (ir_constant *)0x0) ||
         (iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                             (), (char)iVar11 == '\0')) {
        if ((local_138[1] != (ir_constant *)0x0) &&
           (iVar11 = (*(local_138[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10]
                     )(), (char)iVar11 != '\0')) {
          uVar31 = (uint)((ir_rvalue *)(ir1->value).u64[3])->type->vector_elements;
          cVar9 = ((ir1->super_ir_rvalue).type)->field_0x4;
          if (cVar9 == '\x02') {
            oVar20.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
            ir_constant::ir_constant((ir_constant *)oVar20.val,1.0,uVar31);
          }
          else if (cVar9 == '\x04') {
            oVar20.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
            ir_constant::ir_constant((ir_constant *)oVar20.val,1.0,uVar31);
          }
          else {
            if (cVar9 != '\x03') {
              __assert_fail("!\"unexpected type\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                            ,0x3e6,
                            "ir_rvalue *(anonymous namespace)::ir_algebraic_visitor::handle_expression(ir_expression *)"
                           );
            }
            oVar20.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
            ir_constant::ir_constant((ir_constant *)oVar20.val,(float16_t)0x3c00,uVar31);
          }
          oVar22.val = (ir_rvalue *)(ir1->value).d[1];
          oVar24.val = &ir_builder::neg((ir_rvalue *)(ir1->value).d[3])->super_ir_rvalue;
          oVar20.val = &ir_builder::add(oVar20,oVar24)->super_ir_rvalue;
          piVar21 = (ir_constant *)ir_builder::mul(oVar22,oVar20);
        }
        goto switchD_0017c260_default;
      }
      local_e8.val = (ir_rvalue *)(ir1->value).d[2];
      local_f0.val = (ir_rvalue *)(ir1->value).d[3];
      goto LAB_0017d728;
    }
    break;
  case ir_triop_csel:
    if (local_138[0] == (ir_constant *)0x0) goto switchD_0017c260_default;
    iVar11 = (*(local_138[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                       (local_138[0]);
    if ((char)iVar11 == '\0') {
      iVar11 = (*(piVar23->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(piVar23);
      if ((char)iVar11 == '\0') goto switchD_0017c260_default;
      goto LAB_0017cb54;
    }
LAB_0017ccbd:
    piVar21 = (ir_constant *)(ir1->value).u64[2];
    goto switchD_0017c260_default;
  }
  piVar21 = (ir_constant *)(ir1->value).u64[1];
switchD_0017c260_default:
  ppiVar8 = local_d8;
  if (piVar21 != (ir_constant *)*local_d8) {
    pgVar28 = (ir1->super_ir_rvalue).type;
    piVar23 = piVar21;
    if (((1 < pgVar28->vector_elements) && (pgVar28->matrix_columns == '\x01')) &&
       (((*(uint *)&pgVar28->field_0x4 & 0xfc) < 0xc &&
        ((pgVar28 = (piVar21->super_ir_rvalue).type, pgVar28->vector_elements == '\x01' &&
         ((*(uint *)&pgVar28->field_0x4 & 0xfe) < 0xe)))))) {
      piVar23 = (ir_constant *)exec_node::operator_new(0x38,this->mem_ctx);
      ir_swizzle::ir_swizzle
                ((ir_swizzle *)piVar23,&piVar21->super_ir_rvalue,0,0,0,0,
                 (uint)((ir1->super_ir_rvalue).type)->vector_elements);
    }
    *ppiVar8 = &piVar23->super_ir_rvalue;
    this->progress = true;
  }
  return;
switchD_0017c1d7_caseD_5e:
  goto switchD_0017c260_default;
}

Assistant:

void
ir_algebraic_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   if (!*rvalue)
      return;

   ir_expression *expr = (*rvalue)->as_expression();
   if (!expr || expr->operation == ir_quadop_vector)
      return;

   ir_rvalue *new_rvalue = handle_expression(expr);
   if (new_rvalue == *rvalue)
      return;

   /* If the expr used to be some vec OP scalar returning a vector, and the
    * optimization gave us back a scalar, we still need to turn it into a
    * vector.
    */
   *rvalue = swizzle_if_required(expr, new_rvalue);

   this->progress = true;
}